

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BplusTree.hpp
# Opt level: O3

void __thiscall
sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::erasenonleaf
          (BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *this,int *cur,
          node **p,int *pp,locType *pos)

{
  locType *plVar1;
  unsigned_long_long *puVar2;
  locType *plVar3;
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *pBVar4;
  size_t __n;
  int *piVar5;
  int iVar6;
  int iVar7;
  _func_int *UNRECOVERED_JUMPTABLE;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint uVar9;
  node *pnVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  void *__dest;
  int iVar14;
  long lVar15;
  DynamicFileManager<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
  *pDVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  void *__dest_00;
  undefined8 uStack_a0;
  unsigned_long_long uStack_98;
  int local_8c;
  locType *local_88;
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *local_80;
  undefined1 *local_78;
  long local_70;
  ulong local_68;
  long local_60;
  unsigned_long_long *local_58;
  size_t local_50;
  int *local_48;
  int *local_40;
  uint local_34;
  node *pnVar8;
  
  iVar12 = *cur;
  pnVar8 = p[iVar12];
  iVar7 = pnVar8->sz;
  if (pp[iVar12] + 1 < iVar7) {
    lVar13 = (long)pp[iVar12] + 1;
    do {
      pnVar8->keyvalue[lVar13 + -1] = pnVar8->keyvalue[lVar13];
      (pnVar8->field_0).val[lVar13] = *(long *)((long)&pnVar8->field_0 + lVar13 * 8 + 8);
      lVar13 = lVar13 + 1;
      pnVar8 = p[iVar12];
      iVar7 = pnVar8->sz;
    } while (lVar13 < iVar7);
  }
  pnVar8->sz = iVar7 + -1;
  lVar13 = (long)*cur;
  if (lVar13 == 0) {
    if (iVar7 + -1 == 0) {
      this->depth = this->depth + -1;
      uStack_a0 = 0x10d84f;
      DynamicFileManager<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
      ::release(this->file,this->root);
      this->root = pos[1];
      return;
    }
    pDVar16 = this->file;
    UNRECOVERED_JUMPTABLE =
         (pDVar16->
         super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
         )._vptr_FileManager_Base[3];
  }
  else {
    if (iVar7 < 0x32) {
      iVar7 = pp[lVar13 + -1];
      local_40 = pp;
      if (iVar7 == p[lVar13 + -1]->sz) {
        p[lVar13 + 1] = p[lVar13];
        pp[lVar13 + 1] = iVar7;
        lVar13 = (long)*cur;
        pos[lVar13 + 1] = pos[lVar13];
        pp[lVar13 + -1] = p[lVar13 + -1]->sz + -1;
        lVar13 = (long)*cur;
        pos[lVar13] = (p[lVar13 + -1]->field_0).val[pp[lVar13 + -1]];
        uStack_a0 = 0x10d515;
        iVar6 = (*(this->file->
                  super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
                  )._vptr_FileManager_Base[2])();
        iVar7 = *cur;
        lVar13 = (long)iVar7;
        p[lVar13] = (node *)CONCAT44(extraout_var,iVar6);
        pnVar8 = p[lVar13 + 1];
      }
      else {
        pp[lVar13 + 1] = iVar7 + 1;
        lVar13 = (long)*cur;
        pos[lVar13 + 1] = (p[lVar13 + -1]->field_0).val[pp[lVar13 + 1]];
        uStack_a0 = 0x10d551;
        iVar7 = (*(this->file->
                  super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
                  )._vptr_FileManager_Base[2])();
        pnVar8 = (node *)CONCAT44(extraout_var_00,iVar7);
        iVar7 = *cur;
        lVar13 = (long)iVar7;
        p[lVar13 + 1] = pnVar8;
      }
      pnVar10 = p[iVar12];
      iVar6 = pnVar10->sz;
      iVar14 = pnVar8->sz;
      local_34 = iVar14 + iVar6;
      if ((int)local_34 < 99) {
        pnVar10->keyvalue[iVar6] = p[(long)iVar7 + -1]->keyvalue[local_40[(long)iVar7 + -1]];
        if (iVar14 < 1) {
          lVar19 = (long)iVar14;
        }
        else {
          lVar17 = 0;
          do {
            iVar7 = (int)lVar17;
            (pnVar10->field_0).val[iVar6 + iVar7 + 1] = (pnVar8->field_0).val[lVar17];
            pnVar8 = p[lVar13 + 1];
            puVar2 = pnVar8->keyvalue + lVar17;
            pnVar10 = p[iVar12];
            iVar6 = pnVar10->sz;
            lVar17 = lVar17 + 1;
            pnVar10->keyvalue[iVar7 + 1 + iVar6] = *puVar2;
            iVar14 = pnVar8->sz;
            lVar19 = (long)iVar14;
          } while (lVar17 < lVar19);
        }
        lVar13 = (pnVar8->field_0).val[lVar19];
        iVar12 = iVar6 + iVar14 + 1;
        pnVar10->sz = iVar12;
        (pnVar10->field_0).val[iVar12] = lVar13;
        uStack_a0 = 0x10d883;
        (*(this->file->
          super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
          )._vptr_FileManager_Base[3])(this->file,pos + *cur);
        uStack_a0 = 0x10d895;
        DynamicFileManager<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
        ::release(this->file,pos[(long)*cur + 1]);
        local_8c = *cur + -1;
        uStack_a0 = 0x10d8b6;
        erasenonleaf(this,&local_8c,p,local_40,pos);
      }
      else {
        local_48 = cur;
        local_80 = this;
        local_88 = pos;
        local_78 = (undefined1 *)&uStack_98;
        uVar20 = (ulong)local_34;
        lVar19 = -(uVar20 * 8 + 0x1f & 0xfffffffffffffff0);
        __dest = (void *)((long)&uStack_98 + lVar19);
        __dest_00 = (void *)((long)__dest - (uVar20 * 8 + 0x17 & 0xffffffff0));
        pnVar8 = p[iVar12];
        lVar17 = (long)pnVar8->sz;
        if (0 < lVar17) {
          local_58 = pnVar8->keyvalue;
          local_70 = lVar13;
          local_68 = uVar20;
          local_60 = lVar17;
          local_50 = lVar17 * 8;
          *(undefined8 *)((long)__dest_00 + -8) = 0x10d67d;
          memcpy(__dest,pnVar8,lVar17 * 8);
          __n = local_50;
          puVar2 = local_58;
          *(undefined8 *)((long)__dest_00 + -8) = 0x10d68d;
          memcpy(__dest_00,puVar2,__n);
          lVar17 = local_60;
          uVar20 = local_68;
          lVar13 = local_70;
        }
        uVar9 = local_34;
        *(long *)((long)__dest + lVar17 * 8) = (pnVar8->field_0).val[lVar17];
        *(unsigned_long_long *)((long)__dest_00 + lVar17 * 8) =
             p[(long)*local_48 + -1]->keyvalue[local_40[(long)*local_48 + -1]];
        pnVar10 = p[lVar13 + 1];
        if ((int)lVar17 < (int)uVar9) {
          lVar18 = 0;
          do {
            *(long *)((long)__dest + lVar18 * 8 + lVar17 * 8 + 8) =
                 (pnVar10->field_0).val[(int)lVar18];
            *(unsigned_long_long *)((long)__dest_00 + lVar18 * 8 + lVar17 * 8 + 8) =
                 pnVar10->keyvalue[(int)lVar18];
            lVar18 = lVar18 + 1;
          } while (uVar20 - lVar17 != lVar18);
        }
        lVar17 = (pnVar10->field_0).val[pnVar10->sz];
        *(long *)((long)__dest + (uVar20 + 1) * 8) = lVar17;
        piVar5 = local_48;
        pBVar4 = local_80;
        plVar3 = local_88;
        uVar9 = (uint)(uVar20 + 1 >> 1) & 0x7fffffff;
        pnVar8->sz = uVar9;
        pnVar10->sz = local_34 - uVar9;
        lVar18 = (long)pnVar8->sz;
        if (0 < lVar18) {
          lVar11 = 0;
          do {
            (pnVar8->field_0).val[lVar11] = *(long *)((long)__dest + lVar11 * 8);
            pnVar8 = p[iVar12];
            pnVar8->keyvalue[lVar11] = *(unsigned_long_long *)((long)__dest_00 + lVar11 * 8);
            lVar11 = lVar11 + 1;
            lVar18 = (long)pnVar8->sz;
          } while (lVar11 < lVar18);
        }
        (pnVar8->field_0).val[lVar18] = *(long *)((long)__dest + lVar18 * 8);
        lVar18 = (long)p[iVar12]->sz;
        p[(long)*local_48 + -1]->keyvalue[local_40[(long)*local_48 + -1]] =
             *(unsigned_long_long *)((long)__dest_00 + lVar18 * 8);
        pnVar8 = p[lVar13 + 1];
        lVar11 = (long)pnVar8->sz;
        if (0 < lVar11) {
          lVar15 = 0;
          do {
            (pnVar8->field_0).val[lVar15] =
                 *(long *)(&stack0xffffffffffffff70 + ((int)lVar18 + lVar15) * 8 + lVar19);
            lVar18 = (long)p[iVar12]->sz;
            pnVar8 = p[lVar13 + 1];
            pnVar8->keyvalue[lVar15] =
                 *(unsigned_long_long *)((long)__dest_00 + (lVar18 + lVar15) * 8 + 8);
            lVar15 = lVar15 + 1;
            lVar11 = (long)pnVar8->sz;
          } while (lVar15 < lVar11);
        }
        (pnVar8->field_0).val[lVar11] = lVar17;
        pDVar16 = local_80->file;
        plVar1 = local_88 + *local_48;
        UNRECOVERED_JUMPTABLE =
             (pDVar16->
             super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
             )._vptr_FileManager_Base[3];
        *(undefined8 *)((long)__dest_00 + -8) = 0x10d80d;
        (*UNRECOVERED_JUMPTABLE)(pDVar16,plVar1);
        pDVar16 = pBVar4->file;
        iVar12 = *piVar5;
        UNRECOVERED_JUMPTABLE =
             (pDVar16->
             super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
             )._vptr_FileManager_Base[3];
        *(undefined8 *)((long)__dest_00 + -8) = 0x10d823;
        (*UNRECOVERED_JUMPTABLE)(pDVar16,plVar3 + (long)iVar12 + 1);
        pDVar16 = pBVar4->file;
        iVar12 = *piVar5;
        UNRECOVERED_JUMPTABLE =
             (pDVar16->
             super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
             )._vptr_FileManager_Base[3];
        *(undefined8 *)((long)__dest_00 + -8) = 0x10d839;
        (*UNRECOVERED_JUMPTABLE)(pDVar16,plVar3 + (long)iVar12 + -1);
      }
      return;
    }
    pDVar16 = this->file;
    pos = pos + lVar13;
    UNRECOVERED_JUMPTABLE =
         (pDVar16->
         super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
         )._vptr_FileManager_Base[3];
  }
  (*UNRECOVERED_JUMPTABLE)(pDVar16,pos);
  return;
}

Assistant:

void erasenonleaf(const int &cur, node **p, int *pp, locType *pos) {
            node *&x = p[cur];
            int i, j = pp[cur];
            for (i = j + 1; i < x->sz; ++i)x->keyvalue[i - 1] = x->keyvalue[i], x->pointer[i] = x->pointer[i + 1];
            --x->sz;
            if (!cur) {
                if (!x->sz) {
                    --depth;
                    file->release(root);
                    root = pos[1];
                } else {
                    file->save(pos[0]);
                }
                return;
            }
            if (x->sz >= degree - 1 >> 1) {
                file->save(pos[cur]);
                return;
            }
            if (pp[cur - 1] == p[cur - 1]->sz) {
                p[cur + 1] = p[cur];
                pp[cur + 1] = pp[cur - 1];
                pos[cur + 1] = pos[cur];
                pp[cur - 1] = p[cur - 1]->sz - 1;
                pos[cur] = p[cur - 1]->pointer[pp[cur - 1]];
                p[cur] = file->read(pos[cur]);
            } else {
                pp[cur + 1] = pp[cur - 1] + 1;
                pos[cur + 1] = p[cur - 1]->pointer[pp[cur + 1]];
                p[cur + 1] = file->read(pos[cur + 1]);
            }
            node *&y = p[cur + 1];
            if (x->sz + y->sz < degree - 1) {
                x->keyvalue[x->sz] = p[cur - 1]->keyvalue[pp[cur - 1]];
                for (i = 0; i < y->sz; ++i)
                    x->pointer[x->sz + 1 + i] = y->pointer[i], x->keyvalue[x->sz + 1 + i] = y->keyvalue[i];
                x->pointer[x->sz += 1 + y->sz] = y->pointer[y->sz];
                file->save(pos[cur]);
                file->release(pos[cur + 1]);
                erasenonleaf(cur - 1, p, pp, pos);
            } else {
                int newsz = x->sz + y->sz + 1;
                locType tmpp[newsz + 1];
                Key tmpk[newsz], old = y->keyvalue[0];
                for (i = 0; i < x->sz; ++i)tmpp[i] = x->pointer[i], tmpk[i] = x->keyvalue[i];
                tmpp[x->sz] = x->pointer[x->sz];
                tmpk[x->sz] = p[cur - 1]->keyvalue[pp[cur - 1]];
                for (i = x->sz + 1; i < newsz; ++i)
                    tmpp[i] = y->pointer[i - x->sz - 1], tmpk[i] = y->keyvalue[i - x->sz - 1];
                tmpp[newsz] = y->pointer[y->sz];
                x->sz = newsz >> 1;
                y->sz = newsz - x->sz - 1;
                for (i = 0; i < x->sz; ++i)x->pointer[i] = tmpp[i], x->keyvalue[i] = tmpk[i];
                x->pointer[x->sz] = tmpp[x->sz];
                p[cur - 1]->keyvalue[pp[cur - 1]] = tmpk[x->sz];
                for (i = 0; i < y->sz; ++i)y->pointer[i] = tmpp[i + x->sz + 1], y->keyvalue[i] = tmpk[i + x->sz + 1];
                y->pointer[y->sz] = tmpp[newsz];
                file->save(pos[cur]);
                file->save(pos[cur + 1]);
                file->save(pos[cur - 1]);
            }
        }